

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnSimdStoreLaneExpr
          (ExprVisitorDelegate *this,SimdStoreLaneExpr *expr)

{
  WatWriter *pWVar1;
  bool bVar2;
  NextChar next_char;
  Info local_70;
  
  pWVar1 = this->writer_;
  Opcode::GetInfo(&local_70,&expr->opcode);
  WritePuts(pWVar1,local_70.name,Space);
  WriteMemoryVarUnlessZero
            (this->writer_,&(expr->super_MemoryExpr<(wabt::ExprType)45>).memidx,next_char);
  if (expr->offset != 0) {
    Writef(this->writer_,"offset=%lu");
  }
  bVar2 = Opcode::IsNaturallyAligned(&expr->opcode,expr->align);
  if (!bVar2) {
    Writef(this->writer_,"align=%lu",expr->align);
  }
  Writef(this->writer_,"%lu",expr->val);
  pWVar1 = this->writer_;
  if (pWVar1->next_char_ == ForceNewline) {
    WriteNextChar(pWVar1);
  }
  pWVar1->next_char_ = Newline;
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnSimdStoreLaneExpr(
    SimdStoreLaneExpr* expr) {
  writer_->WritePutsSpace(expr->opcode.GetName());
  writer_->WriteMemoryVarUnlessZero(expr->memidx, NextChar::Space);
  if (expr->offset) {
    writer_->Writef("offset=%" PRIaddress, expr->offset);
  }
  if (!expr->opcode.IsNaturallyAligned(expr->align)) {
    writer_->Writef("align=%" PRIaddress, expr->align);
  }
  writer_->Writef("%" PRIu64, (expr->val));
  writer_->WriteNewline(NO_FORCE_NEWLINE);
  return Result::Ok;
}